

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O2

void P_WriteDemoWeaponsChunk(BYTE **demo)

{
  uint i;
  ulong uVar1;
  
  WriteWord((short)Weapons_ntoh.Count,demo);
  for (uVar1 = 1; uVar1 < Weapons_ntoh.Count; uVar1 = uVar1 + 1) {
    WriteString(FName::NameData.NameArray
                [(Weapons_ntoh.Array[uVar1]->super_PClassInventory).super_PClassActor.super_PClass.
                 super_PNativeStruct.super_PStruct.super_PNamedType.TypeName.Index].Text,demo);
  }
  return;
}

Assistant:

void P_WriteDemoWeaponsChunk(BYTE **demo)
{
	WriteWord(Weapons_ntoh.Size(), demo);
	for (unsigned int i = 1; i < Weapons_ntoh.Size(); ++i)
	{
		WriteString(Weapons_ntoh[i]->TypeName.GetChars(), demo);
	}
}